

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void writeRuleText(FILE *out,rule *rp)

{
  undefined8 *puVar1;
  undefined8 *in_RSI;
  FILE *in_RDI;
  int k;
  symbol *sp;
  int j;
  int local_24;
  int local_14;
  
  fprintf(in_RDI,"%s ::=",*(undefined8 *)*in_RSI);
  for (local_14 = 0; local_14 < *(int *)(in_RSI + 3); local_14 = local_14 + 1) {
    puVar1 = *(undefined8 **)(in_RSI[4] + (long)local_14 * 8);
    if (*(int *)((long)puVar1 + 0xc) == 2) {
      fprintf(in_RDI," %s",**(undefined8 **)puVar1[0xc]);
      for (local_24 = 1; local_24 < *(int *)(puVar1 + 0xb); local_24 = local_24 + 1) {
        fprintf(in_RDI,"|%s",**(undefined8 **)(puVar1[0xc] + (long)local_24 * 8));
      }
    }
    else {
      fprintf(in_RDI," %s",*puVar1);
    }
  }
  return;
}

Assistant:

static void writeRuleText(FILE *out, struct rule *rp){
  int j;
  fprintf(out,"%s ::=", rp->lhs->name);
  for(j=0; j<rp->nrhs; j++){
    struct symbol *sp = rp->rhs[j];
    if( sp->type!=MULTITERMINAL ){
      fprintf(out," %s", sp->name);
    }else{
      int k;
      fprintf(out," %s", sp->subsym[0]->name);
      for(k=1; k<sp->nsubsym; k++){
        fprintf(out,"|%s",sp->subsym[k]->name);
      }
    }
  }
}